

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCV.cpp
# Opt level: O3

bool TCV::isMatchType(string *lhs,string *rhs)

{
  size_t __n;
  int iVar1;
  
  iVar1 = std::__cxx11::string::compare((char *)rhs);
  if (((((iVar1 != 0) || (iVar1 = std::__cxx11::string::compare((char *)lhs), iVar1 != 0)) &&
       ((iVar1 = std::__cxx11::string::compare((char *)rhs), iVar1 != 0 ||
        (iVar1 = std::__cxx11::string::compare((char *)lhs), iVar1 != 0)))) &&
      ((iVar1 = std::__cxx11::string::compare((char *)rhs), iVar1 != 0 ||
       (iVar1 = std::__cxx11::string::compare((char *)lhs), iVar1 != 0)))) &&
     ((iVar1 = std::__cxx11::string::compare((char *)rhs), iVar1 != 0 ||
      (iVar1 = std::__cxx11::string::compare((char *)lhs), iVar1 != 0)))) {
    __n = rhs->_M_string_length;
    if (__n != lhs->_M_string_length) {
      return false;
    }
    if (__n != 0) {
      iVar1 = bcmp((rhs->_M_dataplus)._M_p,(lhs->_M_dataplus)._M_p,__n);
      return iVar1 == 0;
    }
  }
  return true;
}

Assistant:

bool TCV::isMatchType(const std::string &lhs, const std::string &rhs) {
    if ((rhs == "integer" && lhs == "intnum") || (rhs == "intnum" && lhs == "integer")) return true;
    else if ((rhs == "float" && lhs == "floatnum") || (rhs == "floatnum" && lhs == "float")) return true;
    else return rhs == lhs;
}